

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

bool __thiscall
soplex::SPxLPBase<double>::readMPS
          (SPxLPBase<double> *this,istream *p_input,NameSet *p_rnames,NameSet *p_cnames,
          DIdxSet *p_intvars)

{
  bool bVar1;
  Section SVar2;
  int iVar3;
  Sense SVar4;
  Verbosity VVar5;
  long in_RCX;
  long in_RDX;
  istream *in_RSI;
  long *in_RDI;
  Verbosity old_verbosity;
  MPSInput mps;
  SPxMemoryException *x;
  NameSet *cnames;
  NameSet *rnames;
  LPColSetBase<double> *cset;
  LPRowSetBase<double> *rset;
  undefined4 in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbdc;
  undefined4 in_stack_fffffffffffffbe0;
  byte bVar6;
  int in_stack_fffffffffffffbe4;
  SPxOut *in_stack_fffffffffffffbf8;
  MPSInput *in_stack_fffffffffffffc00;
  undefined4 in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc0c;
  Real in_stack_fffffffffffffc10;
  int in_stack_fffffffffffffc18;
  int in_stack_fffffffffffffc1c;
  NameSet *in_stack_fffffffffffffc20;
  undefined4 local_3c8;
  Verbosity local_3c4 [23];
  SPxOut *in_stack_fffffffffffffc98;
  NameSet *in_stack_fffffffffffffca0;
  LPRowSetBase<double> *in_stack_fffffffffffffca8;
  MPSInput *in_stack_fffffffffffffcb0;
  int in_stack_fffffffffffffcdc;
  SVSetBase<double> *in_stack_fffffffffffffce0;
  SVSetBase<double> *in_stack_fffffffffffffce8;
  SPxLPBase<double> *in_stack_fffffffffffffcf0;
  SPxOut *in_stack_fffffffffffffdc8;
  NameSet *in_stack_fffffffffffffdd0;
  LPRowSetBase<double> *in_stack_fffffffffffffdd8;
  MPSInput *in_stack_fffffffffffffde0;
  SPxOut *in_stack_fffffffffffffe10;
  DIdxSet *in_stack_fffffffffffffe18;
  NameSet *in_stack_fffffffffffffe20;
  LPColSetBase<double> *in_stack_fffffffffffffe28;
  MPSInput *in_stack_fffffffffffffe30;
  LPRowSetBase<double> *in_stack_fffffffffffffe38;
  MPSInput *in_stack_fffffffffffffe40;
  SPxOut *in_stack_fffffffffffffe88;
  NameSet *in_stack_fffffffffffffe90;
  LPRowSetBase<double> *in_stack_fffffffffffffe98;
  MPSInput *in_stack_fffffffffffffea0;
  
  if (in_RCX == 0) {
    spx_alloc<soplex::NameSet*>((NameSet **)in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c);
    NameSet::NameSet(in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18,
                     in_stack_fffffffffffffc10,
                     (Real)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  }
  NameSet::clear((NameSet *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  if (in_RDX == 0) {
    spx_alloc<soplex::NameSet*>((NameSet **)in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c);
    NameSet::NameSet((NameSet *)0x0,in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18,
                     in_stack_fffffffffffffc10,
                     (Real)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
  }
  NameSet::clear((NameSet *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  clear((SPxLPBase<double> *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  LPColSetBase<double>::memRemax
            ((LPColSetBase<double> *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
             in_stack_fffffffffffffbdc);
  LPColSetBase<double>::reMax
            ((LPColSetBase<double> *)in_stack_fffffffffffffc00,
             (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20));
  MPSInput::MPSInput((MPSInput *)(local_3c4 + 1),in_RSI);
  MPSreadName(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
  SVar2 = MPSInput::section((MPSInput *)(local_3c4 + 1));
  if (SVar2 == OBJSEN) {
    MPSreadObjsen((MPSInput *)0x23d921);
  }
  SVar2 = MPSInput::section((MPSInput *)(local_3c4 + 1));
  if (SVar2 == OBJNAME) {
    MPSreadObjname((MPSInput *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  }
  SVar2 = MPSInput::section((MPSInput *)(local_3c4 + 1));
  if (SVar2 == ROWS) {
    MPSreadRows<double>(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
                        in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
  }
  iVar3 = LPRowSetBase<double>::num((LPRowSetBase<double> *)0x23d9ab);
  (**(code **)(*in_RDI + 0x280))(in_RDI,iVar3);
  SVar2 = MPSInput::section((MPSInput *)(local_3c4 + 1));
  if (SVar2 == COLUMNS) {
    MPSreadCols<double>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                        (NameSet *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                        in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  }
  SVar2 = MPSInput::section((MPSInput *)(local_3c4 + 1));
  if (SVar2 == RHS) {
    MPSreadRhs<double>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90
                       ,in_stack_fffffffffffffe88);
  }
  SVar2 = MPSInput::section((MPSInput *)(local_3c4 + 1));
  if (SVar2 == RANGES) {
    MPSreadRanges<double>
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
               in_stack_fffffffffffffdc8);
  }
  SVar2 = MPSInput::section((MPSInput *)(local_3c4 + 1));
  if (SVar2 == BOUNDS) {
    MPSreadBounds<double>
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
               in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  }
  SVar2 = MPSInput::section((MPSInput *)(local_3c4 + 1));
  if (SVar2 != ENDATA) {
    MPSInput::syntaxError((MPSInput *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0))
    ;
  }
  bVar1 = MPSInput::hasError((MPSInput *)(local_3c4 + 1));
  if (bVar1) {
    (**(code **)(*in_RDI + 0xd8))();
  }
  else {
    SVar4 = MPSInput::objSense((MPSInput *)(local_3c4 + 1));
    (**(code **)(*in_RDI + 0x228))(in_RDI,((SVar4 != MINIMIZE) - 1) + (uint)(SVar4 != MINIMIZE));
    if ((in_RDI[0x36] != 0) &&
       (VVar5 = SPxOut::getVerbosity((SPxOut *)in_RDI[0x36]), 3 < (int)VVar5)) {
      local_3c4[0] = SPxOut::getVerbosity((SPxOut *)in_RDI[0x36]);
      local_3c8 = 4;
      (**(code **)(*(long *)in_RDI[0x36] + 0x10))((long *)in_RDI[0x36],&local_3c8);
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                         (char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      MPSInput::objSense((MPSInput *)(local_3c4 + 1));
      soplex::operator<<((SPxOut *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                         (char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      (**(code **)(*(long *)in_RDI[0x36] + 0x10))((long *)in_RDI[0x36],local_3c4);
    }
    LPColSetBase<double>::num((LPColSetBase<double> *)0x23dc37);
    added2Set(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
              in_stack_fffffffffffffcdc);
    in_stack_fffffffffffffbe4 = LPColSetBase<double>::num((LPColSetBase<double> *)0x23dc62);
    (**(code **)(*in_RDI + 0x288))(in_RDI,in_stack_fffffffffffffbe4);
  }
  if (in_RCX == 0) {
    NameSet::~NameSet((NameSet *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    spx_free<soplex::NameSet*>((NameSet **)0x23dca6);
  }
  if (in_RDX == 0) {
    NameSet::~NameSet((NameSet *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    spx_free<soplex::NameSet*>((NameSet **)0x23dccb);
  }
  bVar1 = MPSInput::hasError((MPSInput *)(local_3c4 + 1));
  bVar6 = bVar1 ^ 0xff;
  MPSInput::~MPSInput((MPSInput *)(local_3c4 + 1));
  return (bool)(bVar6 & 1);
}

Assistant:

inline
bool SPxLPBase<R>::readMPS(
   std::istream& p_input,           ///< input stream.
   NameSet*      p_rnames,          ///< row names.
   NameSet*      p_cnames,          ///< column names.
   DIdxSet*      p_intvars)         ///< integer variables.
{
   LPRowSetBase<R>& rset = *this;
   LPColSetBase<R>& cset = *this;
   NameSet* rnames;
   NameSet* cnames;

   if(p_cnames)
      cnames = p_cnames;
   else
   {
      cnames = nullptr;
      spx_alloc(cnames);
      cnames = new(cnames) NameSet();
   }

   cnames->clear();

   if(p_rnames)
      rnames = p_rnames;
   else
   {
      try
      {
         rnames = nullptr;
         spx_alloc(rnames);
         rnames = new(rnames) NameSet();
      }
      catch(const SPxMemoryException& x)
      {
         if(!p_cnames)
         {
            cnames->~NameSet();
            spx_free(cnames);
         }

         throw x;
      }
   }

   rnames->clear();

   SPxLPBase<R>::clear(); // clear the LP.

   cset.memRemax(Init_NZos);
   cset.reMax(Init_Cols);

   MPSInput mps(p_input);

   MPSreadName(mps, spxout);

   if(mps.section() == MPSInput::OBJSEN)
      MPSreadObjsen(mps);

   if(mps.section() == MPSInput::OBJNAME)
      MPSreadObjname(mps);

   if(mps.section() == MPSInput::ROWS)
      MPSreadRows(mps, rset, *rnames, spxout);

   addedRows(rset.num());

   if(mps.section() == MPSInput::COLUMNS)
      MPSreadCols(mps, rset, *rnames, cset, *cnames, p_intvars);

   if(mps.section() == MPSInput::RHS)
      MPSreadRhs(mps, rset, *rnames, spxout);

   if(mps.section() == MPSInput::RANGES)
      MPSreadRanges(mps, rset, *rnames, spxout);

   if(mps.section() == MPSInput::BOUNDS)
      MPSreadBounds(mps, cset, *cnames, p_intvars, spxout);

   if(mps.section() != MPSInput::ENDATA)
      mps.syntaxError();

   if(mps.hasError())
      clear();
   else
   {
      changeSense(mps.objSense() == MPSInput::MINIMIZE ? SPxLPBase<R>::MINIMIZE : SPxLPBase<R>::MAXIMIZE);

      SPX_MSG_INFO2((*spxout), (*spxout) << "IMPSRD06 Objective sense: " << ((mps.objSense() ==
                    MPSInput::MINIMIZE) ? "Minimize\n" : "Maximize\n"));

      added2Set(
         *(reinterpret_cast<SVSetBase<R>*>(static_cast<LPRowSetBase<R>*>(this))),
         *(reinterpret_cast<SVSetBase<R>*>(static_cast<LPColSetBase<R>*>(this))),
         cset.num());
      addedCols(cset.num());

      assert(isConsistent());
   }

   if(p_cnames == nullptr)
   {
      cnames->~NameSet();
      spx_free(cnames);
   }

   if(p_rnames == nullptr)
   {
      rnames->~NameSet();
      spx_free(rnames);
   }

   return !mps.hasError();
}